

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

bool __thiscall double_conversion::Single::LowerBoundaryIsCloser(Single *this)

{
  uint32_t uVar1;
  int iVar2;
  Single *in_RDI;
  bool physical_significand_is_zero;
  undefined1 local_a;
  
  uVar1 = AsUint32(in_RDI);
  local_a = false;
  if ((uVar1 & 0x7fffff) == 0) {
    iVar2 = Exponent(in_RDI);
    local_a = iVar2 != -0x95;
  }
  return local_a;
}

Assistant:

bool LowerBoundaryIsCloser() const {
    // The boundary is closer if the significand is of the form f == 2^p-1 then
    // the lower boundary is closer.
    // Think of v = 1000e10 and v- = 9999e9.
    // Then the boundary (== (v - v-)/2) is not just at a distance of 1e9 but
    // at a distance of 1e8.
    // The only exception is for the smallest normal: the largest denormal is
    // at the same distance as its successor.
    // Note: denormals have the same exponent as the smallest normals.
    bool physical_significand_is_zero = ((AsUint32() & kSignificandMask) == 0);
    return physical_significand_is_zero && (Exponent() != kDenormalExponent);
  }